

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O2

void prssyn(prscxdef *ctx,objnum objn,uchar *prefix,uchar *synto,uchar *synfrom)

{
  prpnum pVar1;
  prpnum prop;
  undefined8 in_RAX;
  size_t pfxlen;
  uint16_t tmp;
  undefined6 uStack_38;
  uchar buf [2];
  
  _uStack_38 = in_RAX;
  pfxlen = strlen((char *)prefix);
  pVar1 = prssynp(ctx,prefix,pfxlen,synto);
  prop = prssynp(ctx,prefix,pfxlen,synfrom);
  _uStack_38 = CONCAT26(pVar1,uStack_38);
  objsetp(ctx->prscxmem,objn,prop,0xf,buf,(objucxdef *)0x0);
  return;
}

Assistant:

static void prssyn(prscxdef *ctx, objnum objn, uchar *prefix,
                   uchar *synto, uchar *synfrom)
{
    size_t   plen = strlen((char *)prefix);
    prpnum   propto;
    prpnum   propfrom;
    uchar    buf[2];

    /* get the property numbers for the 'to' and 'from' strings */
    propto = prssynp(ctx, prefix, plen, synto);
    propfrom = prssynp(ctx, prefix, plen, synfrom);

    /* set the synonym property */
    oswp2(buf, propto);
    objsetp(ctx->prscxmem, (mcmon)objn, propfrom, DAT_SYN, buf,
            (objucxdef *)0);
}